

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribConversion
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLfloat x,GLfloat y,GLfloat z,
               GLfloat w)

{
  GLfloat index_00;
  CallLogWrapper *this;
  qpTestResult qVar1;
  int (*paiVar2) [4];
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_208;
  int local_88;
  int local_84;
  GLint referenceAsGLintMax [4];
  GLint referenceAsGLintMin [4];
  undefined1 local_5c [8];
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  GLfloat w_local;
  GLfloat z_local;
  GLfloat y_local;
  GLfloat x_local;
  GLint index_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  attribValue.m_postguard[2] = (int)w;
  attribValue.m_postguard[3] = (int)z;
  w_local = y;
  z_local = x;
  y_local = (GLfloat)index;
  _x_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[4]> *)local_5c);
  this = _x_local;
  index_00 = y_local;
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  glu::CallLogWrapper::glGetVertexAttribiv(this,(GLuint)index_00,0x8626,*paiVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
            ((StateQueryMemoryWriteGuard<int[4]> *)local_5c,(TestContext *)gl_local);
  referenceAsGLintMax[2] = roundGLfloatToNearestIntegerDown<int>(z_local);
  referenceAsGLintMax[3] = roundGLfloatToNearestIntegerDown<int>(w_local);
  referenceAsGLintMin[0] =
       roundGLfloatToNearestIntegerDown<int>((GLfloat)attribValue.m_postguard[3]);
  referenceAsGLintMin[1] =
       roundGLfloatToNearestIntegerDown<int>((GLfloat)attribValue.m_postguard[2]);
  local_88 = roundGLfloatToNearestIntegerUp<int>(z_local);
  local_84 = roundGLfloatToNearestIntegerUp<int>(w_local);
  referenceAsGLintMax[0] = roundGLfloatToNearestIntegerUp<int>((GLfloat)attribValue.m_postguard[3]);
  referenceAsGLintMax[1] = roundGLfloatToNearestIntegerUp<int>((GLfloat)attribValue.m_postguard[2]);
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  if ((((((*paiVar2)[0] < referenceAsGLintMax[2]) ||
        (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
        local_88 < (*paiVar2)[0])) ||
       (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       (*paiVar2)[1] < referenceAsGLintMax[3])) ||
      ((paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       local_84 < (*paiVar2)[1] ||
       (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       (*paiVar2)[2] < referenceAsGLintMin[0])))) ||
     ((paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
      referenceAsGLintMax[0] < (*paiVar2)[2] ||
      ((paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       (*paiVar2)[3] < referenceAsGLintMin[1] ||
       (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       referenceAsGLintMax[1] < (*paiVar2)[3])))))) {
    this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_208,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_208,(char (*) [29])"// ERROR: expected in range ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c3fdfc);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMax + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_88);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2b7b6d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c3fdfc);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMax + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_84);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2b7b6d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c3fdfc);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMin);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMax);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2b7b6d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c3fdfc);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMin + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,referenceAsGLintMax + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2b8b5f6);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])"; Input=");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&z_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a95d82);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&w_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a95d82);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)(attribValue.m_postguard + 3));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a95d82);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)(attribValue.m_postguard + 2));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_208);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"Got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribConversion (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLfloat x, GLfloat y, GLfloat z, GLfloat w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> attribValue;
	gl.glGetVertexAttribiv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	const GLint referenceAsGLintMin[] =
	{
		roundGLfloatToNearestIntegerDown<GLint>(x),
		roundGLfloatToNearestIntegerDown<GLint>(y),
		roundGLfloatToNearestIntegerDown<GLint>(z),
		roundGLfloatToNearestIntegerDown<GLint>(w)
	};
	const GLint referenceAsGLintMax[] =
	{
		roundGLfloatToNearestIntegerUp<GLint>(x),
		roundGLfloatToNearestIntegerUp<GLint>(y),
		roundGLfloatToNearestIntegerUp<GLint>(z),
		roundGLfloatToNearestIntegerUp<GLint>(w)
	};

	if (attribValue[0] < referenceAsGLintMin[0] || attribValue[0] > referenceAsGLintMax[0] ||
		attribValue[1] < referenceAsGLintMin[1] || attribValue[1] > referenceAsGLintMax[1] ||
		attribValue[2] < referenceAsGLintMin[2] || attribValue[2] > referenceAsGLintMax[2] ||
		attribValue[3] < referenceAsGLintMin[3] || attribValue[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in range "
			<< "[" << referenceAsGLintMin[0] << " " << referenceAsGLintMax[0] << "], "
			<< "[" << referenceAsGLintMin[1] << " " << referenceAsGLintMax[1] << "], "
			<< "[" << referenceAsGLintMin[2] << " " << referenceAsGLintMax[2] << "], "
			<< "[" << referenceAsGLintMin[3] << " " << referenceAsGLintMax[3] << "]"
			<< "; got "
			<< attribValue[0] << ", "
			<< attribValue[1] << ", "
			<< attribValue[2] << ", "
			<< attribValue[3] << " "
			<< "; Input="
			<< x << "; "
			<< y << "; "
			<< z << "; "
			<< w << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid attribute value");
	}
}